

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiguresTests.cpp
# Opt level: O2

void __thiscall
agge::tests::RectangleTests::RewindingIteratorStartsOverWithPoints(RectangleTests *this)

{
  allocator local_109;
  point local_108;
  undefined8 local_fc;
  undefined4 local_f4;
  undefined8 local_f0;
  undefined4 local_e8;
  undefined8 local_e4;
  undefined4 local_dc;
  undefined8 local_d8;
  undefined4 local_d0;
  undefined8 local_cc;
  undefined4 local_c4;
  point local_b8;
  point local_ac;
  point local_a0;
  point local_94;
  point local_88;
  point local_7c;
  LocationInfo local_68;
  string local_40;
  rectangle r;
  
  rectangle::rectangle(&r,10.1,20.2,30.0,4.7);
  vertex<agge::rectangle>(&r);
  vertex<agge::rectangle>(&r);
  rectangle::rewind(&r,(FILE *)0x0);
  local_b8 = vertex<agge::rectangle>(&r);
  local_ac = vertex<agge::rectangle>(&r);
  local_a0 = vertex<agge::rectangle>(&r);
  local_94 = vertex<agge::rectangle>(&r);
  local_88 = vertex<agge::rectangle>(&r);
  local_7c = vertex<agge::rectangle>(&r);
  local_108.x = 10.1;
  local_108.y = 20.2;
  local_108.command = 1;
  local_fc = 0x41a1999a41f00000;
  local_f4 = 2;
  local_f0 = 0x4096666641f00000;
  local_e4 = 0x409666664121999a;
  local_d8 = 0;
  local_d0 = 0x30;
  local_cc = 0;
  local_c4 = 0;
  local_e8 = local_f4;
  local_dc = local_f4;
  std::__cxx11::string::string
            ((string *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,&local_109);
  ut::LocationInfo::LocationInfo(&local_68,&local_40,0x99);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,6ul>
            ((point (*) [6])&local_108,(point (*) [6])&local_b8,&local_68);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

test( RewindingIteratorStartsOverWithPoints )
			{
				// INIT
				rectangle r(10.1f, 20.2f, 30.0f, 4.7f);

				vertex(r), vertex(r);

				// ACT
				r.rewind(0);

				// ASSERT
				mocks::path::point points[] = { vertex(r), vertex(r), vertex(r), vertex(r), vertex(r), vertex(r), };
				mocks::path::point reference[] = {
					moveto(10.1f, 20.2f), lineto(30.0f, 20.2f), lineto(30.0f, 4.7f), lineto(10.1f, 4.7f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close }, stop(),
				};

				assert_equal(reference, points);
			}